

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void duckdb_parquet::swap(OffsetIndex *a,OffsetIndex *b)

{
  _OffsetIndex__isset _Var1;
  
  std::swap<duckdb::vector<duckdb_parquet::PageLocation,true>>
            (&a->page_locations,&b->page_locations);
  std::swap<duckdb::vector<long,true>>
            (&a->unencoded_byte_array_data_bytes,&b->unencoded_byte_array_data_bytes);
  _Var1 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var1;
  return;
}

Assistant:

void swap(OffsetIndex &a, OffsetIndex &b) {
  using ::std::swap;
  swap(a.page_locations, b.page_locations);
  swap(a.unencoded_byte_array_data_bytes, b.unencoded_byte_array_data_bytes);
  swap(a.__isset, b.__isset);
}